

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O0

int coda_cursor_read_char_array
              (coda_cursor_conflict *cursor,char *dst,coda_array_ordering array_ordering)

{
  int iVar1;
  char *pcVar2;
  coda_type *local_38;
  coda_type *type;
  coda_native_type read_type;
  coda_array_ordering array_ordering_local;
  char *dst_local;
  coda_cursor_conflict *cursor_local;
  
  type._4_4_ = array_ordering;
  _read_type = dst;
  dst_local = (char *)cursor;
  if (((cursor == (coda_cursor_conflict *)0x0) || (cursor->n < 1)) ||
     (cursor->stack[cursor->n + -1].type == (coda_dynamic_type_struct *)0x0)) {
    coda_set_error(-100,"invalid cursor argument (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                   ,0x1028);
    cursor_local._4_4_ = -1;
  }
  else if (dst == (char *)0x0) {
    coda_set_error(-100,"dst argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                   ,0x102d);
    cursor_local._4_4_ = -1;
  }
  else {
    if ((cursor->stack[cursor->n + -1].type)->backend < coda_backend_memory) {
      local_38 = (coda_type *)cursor->stack[cursor->n + -1].type;
    }
    else {
      local_38 = (cursor->stack[cursor->n + -1].type)->definition;
    }
    if (local_38->type_class == coda_array_class) {
      iVar1 = get_array_element_read_type(local_38,(coda_native_type *)&type);
      if (iVar1 == 0) {
        if ((coda_native_type)type == coda_native_type_char) {
          iVar1 = read_char_array((coda_cursor_conflict *)dst_local,_read_type,type._4_4_);
          if (iVar1 == 0) {
            cursor_local._4_4_ = 0;
          }
          else {
            cursor_local._4_4_ = -1;
          }
        }
        else {
          pcVar2 = coda_type_get_native_type_name((coda_native_type)type);
          coda_set_error(-0x69,"can not read %s data using a char data type",pcVar2);
          cursor_local._4_4_ = -1;
        }
      }
      else {
        cursor_local._4_4_ = -1;
      }
    }
    else {
      pcVar2 = coda_type_get_class_name(local_38->type_class);
      coda_set_error(-0x69,"cursor does not refer to an array (current type is %s)",pcVar2);
      cursor_local._4_4_ = -1;
    }
  }
  return cursor_local._4_4_;
}

Assistant:

LIBCODA_API int coda_cursor_read_char_array(const coda_cursor *cursor, char *dst, coda_array_ordering array_ordering)
{
    coda_native_type read_type;
    coda_type *type;

    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dst == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    if (type->type_class != coda_array_class)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "cursor does not refer to an array (current type is %s)",
                       coda_type_get_class_name(type->type_class));
        return -1;
    }

    if (get_array_element_read_type(type, &read_type) != 0)
    {
        return -1;
    }
    switch (read_type)
    {
        case coda_native_type_char:
            if (read_char_array(cursor, dst, array_ordering) != 0)
            {
                return -1;
            }
            break;
        default:
            coda_set_error(CODA_ERROR_INVALID_TYPE, "can not read %s data using a char data type",
                           coda_type_get_native_type_name(read_type));
            return -1;
    }

    return 0;
}